

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

string * __thiscall
helics::RerouteFilterOperation::rerouteOperation
          (string *__return_storage_ptr__,RerouteFilterOperation *this,string *src,string *dest)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  shared_handle cond;
  regex reg;
  
  gmlc::libguarded::
  shared_guarded<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  ::lock_shared(&cond,&this->conditions);
  if (((cond.data)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    gmlc::libguarded::
    atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
    ::load(&local_88,&this->newDest);
    newDestGeneration(__return_storage_ptr__,src,dest,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    for (p_Var2 = (_Rb_tree_node_base *)
                  ((cond.data)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &((cond.data)->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&reg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1),
                 0x10);
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (dest,&reg,0x10);
      if (bVar1) {
        gmlc::libguarded::
        atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
        ::load(&local_a8,&this->newDest);
        newDestGeneration(__return_storage_ptr__,src,dest,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&reg);
        goto LAB_00213450;
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&reg);
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dest);
  }
LAB_00213450:
  std::shared_lock<std::shared_mutex>::~shared_lock(&cond.m_handle_lock);
  return __return_storage_ptr__;
}

Assistant:

std::string RerouteFilterOperation::rerouteOperation(const std::string& src,
                                                     const std::string& dest) const
{
    auto cond = conditions.lock_shared();
    if (cond->empty()) {
        return newDestGeneration(src, dest, newDest.load());
    }

    for (const auto& condition : *cond) {
        const std::regex reg(condition);
        if (std::regex_search(dest, reg, std::regex_constants::match_any)) {
            return newDestGeneration(src, dest, newDest.load());
        }
    }
    return dest;
}